

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall
ImVector<ImGuiSettingsHandler>::push_front(ImVector<ImGuiSettingsHandler> *this,value_type *v)

{
  char *pcVar1;
  _func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *p_Var2;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *p_Var3;
  void *pvVar4;
  ImGuiID IVar5;
  undefined4 uVar6;
  uint uVar7;
  ImGuiSettingsHandler *pIVar8;
  long lVar9;
  uint uVar10;
  
  uVar7 = this->Size;
  if (uVar7 == 0) {
    if (this->Capacity == 0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar8 = (ImGuiSettingsHandler *)(*GImAllocatorAllocFunc)(0x180,GImAllocatorUserData);
      if (this->Data != (ImGuiSettingsHandler *)0x0) {
        memcpy(pIVar8,this->Data,(long)this->Size * 0x30);
        if (this->Data != (ImGuiSettingsHandler *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(this->Data,GImAllocatorUserData);
      }
      this->Data = pIVar8;
      this->Capacity = 8;
      lVar9 = (long)this->Size;
    }
    else {
      pIVar8 = this->Data;
      lVar9 = 0;
    }
    pIVar8 = pIVar8 + lVar9;
  }
  else {
    if ((int)uVar7 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4e6,
                    "iterator ImVector<ImGuiSettingsHandler>::insert(const_iterator, const value_type &) [T = ImGuiSettingsHandler]"
                   );
    }
    if (uVar7 == this->Capacity) {
      uVar10 = (uVar7 >> 1) + uVar7;
      if (uVar10 <= uVar7 + 1) {
        uVar10 = uVar7 + 1;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar8 = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((ulong)uVar10 * 0x30,GImAllocatorUserData);
      if (this->Data != (ImGuiSettingsHandler *)0x0) {
        memcpy(pIVar8,this->Data,(long)this->Size * 0x30);
        if (this->Data != (ImGuiSettingsHandler *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(this->Data,GImAllocatorUserData);
      }
      this->Data = pIVar8;
      this->Capacity = uVar10;
      uVar7 = this->Size;
      if ((int)uVar7 < 1) goto LAB_0019e15d;
    }
    else {
      pIVar8 = this->Data;
    }
    memmove(pIVar8 + 1,pIVar8,(ulong)uVar7 * 0x30);
    pIVar8 = this->Data;
  }
LAB_0019e15d:
  pcVar1 = v->TypeName;
  IVar5 = v->TypeHash;
  uVar6 = *(undefined4 *)&v->field_0xc;
  p_Var2 = v->ReadOpenFn;
  p_Var3 = v->ReadLineFn;
  pvVar4 = v->UserData;
  pIVar8->WriteAllFn = v->WriteAllFn;
  pIVar8->UserData = pvVar4;
  pIVar8->ReadOpenFn = p_Var2;
  pIVar8->ReadLineFn = p_Var3;
  pIVar8->TypeName = pcVar1;
  pIVar8->TypeHash = IVar5;
  *(undefined4 *)&pIVar8->field_0xc = uVar6;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const value_type& v)                 { if (Size == 0) push_back(v); else insert(Data, v); }